

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio.c
# Opt level: O2

int write_header(archive_write *a,archive_entry *entry)

{
  long lVar1;
  long *plVar2;
  la_int64_t *plVar3;
  ulong uVar4;
  wchar_t wVar5;
  uint uVar6;
  mode_t mVar7;
  int iVar8;
  archive_string_conv *sc;
  int *piVar9;
  char *pcVar10;
  dev_t dVar11;
  la_int64_t lVar12;
  void *__ptr;
  time_t v;
  size_t sVar13;
  ulong uVar14;
  char *pcVar15;
  int iVar16;
  long lVar17;
  size_t length;
  ulong uVar18;
  size_t len;
  int local_a4;
  char *p;
  size_t local_98;
  char *path;
  char h [76];
  
  plVar3 = (la_int64_t *)a->format_data;
  sc = get_sconv(a);
  wVar5 = _archive_entry_pathname_l(entry,&path,&len,sc);
  uVar18 = 0;
  iVar16 = 0;
  if (wVar5 == L'\0') {
LAB_00331310:
    local_98 = len;
    h[0] = '\0';
    h[1] = '\0';
    h[2] = '\0';
    h[3] = '\0';
    h[4] = '\0';
    h[5] = '\0';
    h[6] = '\0';
    h[7] = '\0';
    h[8] = '\0';
    h[9] = '\0';
    h[10] = '\0';
    h[0xb] = '\0';
    h[0xc] = '\0';
    h[0xd] = '\0';
    h[0xe] = '\0';
    h[0xf] = '\0';
    h[0x10] = '\0';
    h[0x11] = '\0';
    h[0x12] = '\0';
    h[0x13] = '\0';
    h[0x14] = '\0';
    h[0x15] = '\0';
    h[0x16] = '\0';
    h[0x17] = '\0';
    h[0x18] = '\0';
    h[0x19] = '\0';
    h[0x1a] = '\0';
    h[0x1b] = '\0';
    h[0x1c] = '\0';
    h[0x1d] = '\0';
    h[0x1e] = '\0';
    h[0x1f] = '\0';
    h[0x20] = '\0';
    h[0x21] = '\0';
    h[0x22] = '\0';
    h[0x23] = '\0';
    h[0x24] = '\0';
    h[0x25] = '\0';
    h[0x26] = '\0';
    h[0x27] = '\0';
    h[0x28] = '\0';
    h[0x29] = '\0';
    h[0x2a] = '\0';
    h[0x2b] = '\0';
    h[0x2c] = '\0';
    h[0x2d] = '\0';
    h[0x2e] = '\0';
    h[0x2f] = '\0';
    h[0x30] = '\0';
    h[0x31] = '\0';
    h[0x32] = '\0';
    h[0x33] = '\0';
    h[0x34] = '\0';
    h[0x35] = '\0';
    h[0x36] = '\0';
    h[0x37] = '\0';
    h[0x38] = '\0';
    h[0x39] = '\0';
    h[0x3a] = '\0';
    h[0x3b] = '\0';
    h[0x3c] = '\0';
    h[0x3d] = '\0';
    h[0x3e] = '\0';
    h[0x3f] = '\0';
    h[0x40] = '\0';
    h[0x41] = '\0';
    h[0x42] = '\0';
    h[0x43] = '\0';
    h[0x44] = '\0';
    h[0x45] = '\0';
    h[0x46] = '\0';
    h[0x47] = '\0';
    h[0x48] = '\0';
    h[0x49] = '\0';
    h[0x4a] = '\0';
    h[0x4b] = '\0';
    local_a4 = iVar16;
    format_octal(0x71c7,h,6);
    dVar11 = archive_entry_dev(entry);
    format_octal(dVar11,h + 6,6);
    lVar12 = archive_entry_ino64(entry);
    if (lVar12 != 0) {
      uVar6 = archive_entry_nlink(entry);
      if (uVar6 < 2) {
        uVar18 = plVar3[1] + 1;
        plVar3[1] = uVar18;
      }
      else {
        uVar14 = plVar3[4];
        uVar18 = 0xffffffffffffffff;
        lVar17 = 0;
        do {
          uVar18 = uVar18 + 1;
          if (uVar14 == uVar18) {
            __ptr = (void *)plVar3[2];
            uVar18 = plVar3[1] + 1;
            plVar3[1] = uVar18;
            uVar4 = plVar3[3];
            if (uVar4 <= uVar14) {
              lVar17 = uVar4 * 2;
              if (uVar4 < 0x200) {
                lVar17 = 0x200;
              }
              __ptr = realloc(__ptr,lVar17 << 4);
              if (__ptr == (void *)0x0) goto LAB_003314d3;
              plVar3[3] = lVar17;
              plVar3[2] = (la_int64_t)__ptr;
              uVar14 = plVar3[4];
            }
            *(la_int64_t *)((long)__ptr + uVar14 * 0x10) = lVar12;
            *(int *)((long)__ptr + uVar14 * 0x10 + 8) = (int)uVar18;
            plVar3[4] = uVar14 + 1;
            goto LAB_0033141c;
          }
          lVar1 = lVar17 + 0x10;
          plVar2 = (long *)(plVar3[2] + lVar17);
          lVar17 = lVar1;
        } while (*plVar2 != lVar12);
        uVar18 = (ulong)*(uint *)(plVar3[2] + -8 + lVar1);
      }
LAB_0033141c:
      if ((int)(uint)uVar18 < 0) {
LAB_003314d3:
        pcVar15 = "No memory for ino translation table";
        goto LAB_0033156a;
      }
      if (0x3ffff < (uint)uVar18) {
        pcVar15 = "Too many files for this cpio format";
        iVar16 = 0x22;
        goto LAB_0033156c;
      }
    }
    format_octal(uVar18 & 0xffffffff,h + 0xc,6);
    mVar7 = archive_entry_mode(entry);
    format_octal((ulong)mVar7,h + 0x12,6);
    lVar12 = archive_entry_uid(entry);
    format_octal(lVar12,h + 0x18,6);
    lVar12 = archive_entry_gid(entry);
    format_octal(lVar12,h + 0x1e,6);
    uVar6 = archive_entry_nlink(entry);
    format_octal((ulong)uVar6,h + 0x24,6);
    mVar7 = archive_entry_filetype(entry);
    if ((mVar7 == 0x6000) || (mVar7 = archive_entry_filetype(entry), mVar7 == 0x2000)) {
      dVar11 = archive_entry_dev(entry);
    }
    else {
      dVar11 = 0;
    }
    format_octal(dVar11,h + 0x2a,6);
    v = archive_entry_mtime(entry);
    format_octal(v,h + 0x30,0xb);
    length = (size_t)((int)local_98 + 1);
    format_octal(length,h + 0x3b,6);
    mVar7 = archive_entry_filetype(entry);
    if (mVar7 != 0x8000) {
      archive_entry_set_size(entry,0);
    }
    wVar5 = _archive_entry_symlink_l(entry,&p,&len,sc);
    iVar16 = local_a4;
    if (wVar5 == L'\0') {
LAB_003315c0:
      if ((p == (char *)0x0 || len == 0) || (*p == '\0')) {
        sVar13 = archive_entry_size(entry);
      }
      else {
        sVar13 = strlen(p);
      }
      iVar8 = format_octal(sVar13,h + 0x41,0xb);
      if (iVar8 != 0) {
        archive_set_error(&a->archive,0x22,"File is too large for cpio format.");
        return -0x19;
      }
      iVar8 = __archive_write_output(a,h,0x4c);
      if (iVar8 != 0) {
        return -0x1e;
      }
      iVar8 = __archive_write_output(a,path,length);
      if (iVar8 != 0) {
        return -0x1e;
      }
      lVar12 = archive_entry_size(entry);
      *plVar3 = lVar12;
      if (p == (char *)0x0) {
        return iVar16;
      }
      if (*p == '\0') {
        return iVar16;
      }
      sVar13 = strlen(p);
      iVar8 = __archive_write_output(a,p,sVar13);
      if (iVar8 != 0) {
        return -0x1e;
      }
      return iVar16;
    }
    piVar9 = __errno_location();
    if (*piVar9 != 0xc) {
      pcVar15 = archive_entry_symlink(entry);
      pcVar10 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar15,pcVar10);
      iVar16 = -0x14;
      goto LAB_003315c0;
    }
    pcVar15 = "Can\'t allocate memory for Linkname";
  }
  else {
    piVar9 = __errno_location();
    if (*piVar9 != 0xc) {
      iVar16 = -0x14;
      pcVar15 = archive_entry_pathname(entry);
      pcVar10 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar15,pcVar10);
      goto LAB_00331310;
    }
    pcVar15 = "Can\'t allocate memory for Pathname";
  }
LAB_0033156a:
  iVar16 = 0xc;
LAB_0033156c:
  archive_set_error(&a->archive,iVar16,pcVar15);
  return -0x1e;
}

Assistant:

static int
write_header(struct archive_write *a, struct archive_entry *entry)
{
	struct cpio *cpio;
	const char *p, *path;
	int pathlength, ret, ret_final;
	int64_t	ino;
	char h[76];
	struct archive_string_conv *sconv;
	struct archive_entry *entry_main;
	size_t len;

	cpio = (struct cpio *)a->format_data;
	ret_final = ARCHIVE_OK;
	sconv = get_sconv(a);

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif

	ret = archive_entry_pathname_l(entry, &path, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    archive_entry_pathname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	/* Include trailing null. */
	pathlength = (int)len + 1;

	memset(h, 0, sizeof(h));
	format_octal(070707, h + c_magic_offset, c_magic_size);
	format_octal(archive_entry_dev(entry), h + c_dev_offset, c_dev_size);

	ino = synthesize_ino_value(cpio, entry);
	if (ino < 0) {
		archive_set_error(&a->archive, ENOMEM,
		    "No memory for ino translation table");
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	} else if (ino > 0777777) {
		archive_set_error(&a->archive, ERANGE,
		    "Too many files for this cpio format");
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}
	format_octal(ino & 0777777, h + c_ino_offset, c_ino_size);

	/* TODO: Set ret_final to ARCHIVE_WARN if any of these overflow. */
	format_octal(archive_entry_mode(entry), h + c_mode_offset, c_mode_size);
	format_octal(archive_entry_uid(entry), h + c_uid_offset, c_uid_size);
	format_octal(archive_entry_gid(entry), h + c_gid_offset, c_gid_size);
	format_octal(archive_entry_nlink(entry), h + c_nlink_offset, c_nlink_size);
	if (archive_entry_filetype(entry) == AE_IFBLK
	    || archive_entry_filetype(entry) == AE_IFCHR)
	    format_octal(archive_entry_dev(entry), h + c_rdev_offset, c_rdev_size);
	else
	    format_octal(0, h + c_rdev_offset, c_rdev_size);
	format_octal(archive_entry_mtime(entry), h + c_mtime_offset, c_mtime_size);
	format_octal(pathlength, h + c_namesize_offset, c_namesize_size);

	/* Non-regular files don't store bodies. */
	if (archive_entry_filetype(entry) != AE_IFREG)
		archive_entry_set_size(entry, 0);

	/* Symlinks get the link written as the body of the entry. */
	ret = archive_entry_symlink_l(entry, &p, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    archive_entry_symlink(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	if (len > 0 && p != NULL  &&  *p != '\0')
		ret = format_octal(strlen(p), h + c_filesize_offset,
		    c_filesize_size);
	else
		ret = format_octal(archive_entry_size(entry),
		    h + c_filesize_offset, c_filesize_size);
	if (ret) {
		archive_set_error(&a->archive, ERANGE,
		    "File is too large for cpio format.");
		ret_final = ARCHIVE_FAILED;
		goto exit_write_header;
	}

	ret = __archive_write_output(a, h, sizeof(h));
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	ret = __archive_write_output(a, path, pathlength);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	cpio->entry_bytes_remaining = archive_entry_size(entry);

	/* Write the symlink now. */
	if (p != NULL  &&  *p != '\0') {
		ret = __archive_write_output(a, p, strlen(p));
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
	}
exit_write_header:
	if (entry_main)
		archive_entry_free(entry_main);
	return (ret_final);
}